

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O0

void test_3d_dynamic<30ul,1ul,1ul>(void)

{
  int iVar1;
  int iVar2;
  tuple<int,_int,_int> *ptVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  ulong uVar7;
  long lVar8;
  size_type sVar9;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var10;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var11;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var12;
  reference pvVar13;
  long lVar14;
  tuple<int,_int,_int> *local_110;
  tuple<int,_int,_int> *local_108;
  size_type local_100;
  unsigned_long local_f8;
  value_type true_idx;
  int local_e8;
  int i;
  int j;
  int k;
  tuple<int,_int,_int> *dptr;
  allocator<std::tuple<int,_int,_int>_> local_c1;
  undefined1 local_c0 [8];
  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> data;
  size_type local_a0;
  unsigned_long local_98;
  size_type local_90;
  unsigned_long local_88;
  size_type local_80;
  unsigned_long local_78;
  size_type local_70;
  int local_64;
  size_type local_60;
  bool local_58;
  bool local_57;
  bool local_56;
  bool local_55;
  bool local_54;
  bool local_53;
  bool local_52;
  bool local_51;
  unsigned_long local_50 [3];
  undefined1 local_38 [8];
  layout_mapping_left<dimensions<dyn,_dyn,_dyn>,_dimensions<1,_1,_1>,_dimensions<0,_0,_0>_> l;
  
  local_50[2] = 0x1e;
  local_50[1] = 1;
  local_50[0] = 1;
  std::experimental::
  layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
  ::layout_mapping_regular_precomputed_strides<unsigned_long,unsigned_long,unsigned_long>
            ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
              *)local_38,local_50 + 2,local_50 + 1,local_50);
  local_51 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::is_regular();
  local_52 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x131,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_51,&local_52);
  local_53 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::is_dynamic_stride(0);
  local_54 = false;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x133,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_53,&local_54);
  local_55 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::is_dynamic_stride(1);
  local_56 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x134,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_55,&local_56);
  local_57 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::is_dynamic_stride(2);
  local_58 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(2))","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x135,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_57,&local_58);
  local_60 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                       *)local_38,0);
  local_64 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x137,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_60,&local_64);
  local_70 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                       *)local_38,1);
  local_78 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x138,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_70,&local_78);
  local_80 = std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::stride((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                       *)local_38,2);
  local_88 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(2))","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x139,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_80,&local_88);
  local_90 = std::experimental::
             dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
             size((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                   *)local_38);
  vVar4 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,1);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,2);
  local_98 = vVar4 * vVar5 * vVar6;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x13b,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_90,&local_98);
  local_a0 = std::experimental::detail::
             layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             ::span((layout_mapping_regular_base<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<1UL,_1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL,_0UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                     *)local_38);
  vVar4 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,1);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,2);
  data.super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(vVar4 * vVar5 * vVar6);
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","l[0] * l[1] * l[2]",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x13c,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_a0,
             (unsigned_long *)
             &data.
              super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  vVar4 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,0);
  vVar5 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,1);
  vVar6 = std::experimental::
          dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
          operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                           *)local_38,2);
  std::allocator<std::tuple<int,_int,_int>_>::allocator(&local_c1);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::vector
            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
             local_c0,vVar4 * vVar5 * vVar6,&local_c1);
  std::allocator<std::tuple<int,_int,_int>_>::~allocator(&local_c1);
  _j = std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::data
                 ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
                  local_c0);
  i = 0;
  while( true ) {
    uVar7 = (ulong)i;
    vVar4 = std::experimental::
            dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
            operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                             *)local_38,2);
    if (vVar4 <= uVar7) break;
    local_e8 = 0;
    while( true ) {
      uVar7 = (ulong)local_e8;
      vVar4 = std::experimental::
              dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
              operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                               *)local_38,1);
      if (vVar4 <= uVar7) break;
      true_idx._4_4_ = 0;
      while( true ) {
        uVar7 = (ulong)true_idx._4_4_;
        vVar4 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_38,0);
        if (vVar4 <= uVar7) break;
        lVar8 = (long)true_idx._4_4_;
        vVar4 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_38,0);
        lVar14 = (long)local_e8;
        vVar5 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_38,0);
        vVar6 = std::experimental::
                dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>::
                operator[]<int>((dimensions<18446744073709551615UL,_18446744073709551615UL,_18446744073709551615UL>
                                 *)local_38,1);
        local_f8 = lVar8 + vVar4 * lVar14 + vVar5 * vVar6 * (long)i;
        local_100 = std::experimental::
                    layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                    ::index<int,int,int>
                              ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                                *)local_38,true_idx._4_4_,local_e8,i);
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x148,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_100,&local_f8
                  );
        ptVar3 = _j;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        local_108 = ptVar3 + sVar9;
        local_110 = _j + local_f8;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x14a,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",&local_108,
                   &local_110);
        ptVar3 = _j;
        iVar1 = true_idx._4_4_;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        p_Var10 = std::get<0ul,int,int,int>(ptVar3 + sVar9);
        ptVar3 = _j;
        iVar2 = local_e8;
        *p_Var10 = iVar1;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        p_Var11 = std::get<1ul,int,int,int>(ptVar3 + sVar9);
        ptVar3 = _j;
        iVar1 = i;
        *p_Var11 = iVar2;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        p_Var12 = std::get<2ul,int,int,int>(ptVar3 + sVar9);
        ptVar3 = _j;
        *p_Var12 = iVar1;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        p_Var10 = std::get<0ul,int,int,int>(ptVar3 + sVar9);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x150,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",p_Var10,
                   (int *)((long)&true_idx + 4));
        ptVar3 = _j;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        p_Var11 = std::get<1ul,int,int,int>(ptVar3 + sVar9);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x151,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",p_Var11,&local_e8);
        ptVar3 = _j;
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        p_Var12 = std::get<2ul,int,int,int>(ptVar3 + sVar9);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x152,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",p_Var12,&i);
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        pvVar13 = std::
                  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::at
                            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                              *)local_c0,sVar9);
        p_Var10 = std::get<0ul,int,int,int>(pvVar13);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(data.at(l.index(i, j, k))))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x155,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",p_Var10,
                   (int *)((long)&true_idx + 4));
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        pvVar13 = std::
                  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::at
                            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                              *)local_c0,sVar9);
        p_Var11 = std::get<1ul,int,int,int>(pvVar13);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(data.at(l.index(i, j, k))))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x156,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",p_Var11,&local_e8);
        sVar9 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615ul,18446744073709551615ul,18446744073709551615ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)local_38,true_idx._4_4_,local_e8,i);
        pvVar13 = std::
                  vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::at
                            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                              *)local_c0,sVar9);
        p_Var12 = std::get<2ul,int,int,int>(pvVar13);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(data.at(l.index(i, j, k))))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x157,"void test_3d_dynamic() [X = 30UL, Y = 1UL, Z = 1UL]",p_Var12,&i);
        true_idx._4_4_ = true_idx._4_4_ + 1;
      }
      local_e8 = local_e8 + 1;
    }
    i = i + 1;
  }
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::~vector
            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
             local_c0);
  return;
}

Assistant:

void test_3d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn, dyn>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    > const l(X, Y, Z);

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), true);
    BOOST_TEST_EQ((l.is_dynamic_stride(2)), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);
    BOOST_TEST_EQ((l.stride(2)), X * Y);

    BOOST_TEST_EQ((l.size()), l[0] * l[1] * l[2]);
    BOOST_TEST_EQ((l.span()), l[0] * l[1] * l[2]);

    vector<tuple<int, int, int> > data(l[0] * l[1] * l[2]);
    tuple<int, int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j) + (l[0]) * (l[1]) * (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j, k)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j, k)))), j); 
        BOOST_TEST_EQ((std::get<2>(data.at(l.index(i, j, k)))), k); 
    }
}